

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_chi2_test<trng::normal_dist<double>>(normal_dist<double> *d)

{
  double dVar1;
  pointer __s;
  ulong uVar2;
  long lVar3;
  int i;
  int iVar4;
  int i_1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  parameter_type P;
  vector<int,_std::allocator<int>_> count;
  vector<double,_std::allocator<double>_> quantil;
  vector<double,_std::allocator<double>_> p;
  lcg64_shift R;
  AssertionHandler catchAssertionHandler;
  vector<int,_std::allocator<int>_> local_128;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  lcg64_shift local_d0;
  undefined1 local_b8 [16];
  StringRef local_a0;
  AssertionHandler local_90;
  StringRef local_48;
  SourceLineInfo local_38;
  
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __s = (pointer)operator_new(0x200);
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       __s;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = __s;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x80;
  memset(__s,0,0x200);
  iVar4 = 1;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = __s + 0x80;
  do {
    dVar1 = trng::math::detail::inv_Phi<double>((double)iVar4 * 0.0078125);
    local_90.m_assertionInfo.macroName.m_start = (char *)(dVar1 * (d->P).sigma_ + (d->P).mu_);
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_90);
    }
    else {
      *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_90.m_assertionInfo.macroName.m_start;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x80);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_d0,P);
  iVar4 = 0;
  do {
    local_d0.S.r = local_d0.S.r * local_d0.P.a + local_d0.P.b;
    uVar2 = local_d0.S.r >> 0x11 ^ local_d0.S.r;
    uVar2 = uVar2 << 0x1f ^ uVar2;
    dVar1 = trng::math::detail::inv_Phi<double>
                      ((double)(uVar2 >> 1 ^ uVar2 >> 9) * 1.084202172485504e-19 +
                       2.220446049250313e-16);
    dVar1 = dVar1 * (d->P).sigma_ + (d->P).mu_;
    uVar2 = 0;
    do {
      if (dVar1 < local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2] ||
          dVar1 == local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2]) goto LAB_0022d41a;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x7f);
    uVar2 = 0x7f;
LAB_0022d41a:
    __s[uVar2 & 0xffffffff] = __s[uVar2 & 0xffffffff] + 1;
    iVar4 = iVar4 + 1;
    if (iVar4 == 10000) {
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x400);
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x80;
      lVar3 = 0;
      do {
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar3] = 0.0078125;
        (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + lVar3)[1] = 0.0078125;
        lVar3 = lVar3 + 2;
      } while (lVar3 != 0x80);
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      dVar1 = chi_percentil(&local_e8,&local_128);
      local_b8._8_4_ = extraout_XMM0_Dc;
      local_b8._0_8_ = dVar1;
      local_b8._12_4_ = extraout_XMM0_Dd;
      local_a0.m_start = "REQUIRE";
      local_a0.m_size = 7;
      local_38.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_38.line = 0xc2;
      Catch::StringRef::StringRef(&local_48,"(0.01 < c2_p and c2_p < 0.99)");
      Catch::AssertionHandler::AssertionHandler(&local_90,&local_a0,&local_38,local_48,Normal);
      local_a0.m_start =
           (char *)(CONCAT71(local_a0.m_start._1_7_,
                             -((double)local_b8._0_8_ < 0.99) & -(0.01 < (double)local_b8._0_8_)) &
                   0xffffffffffffff01);
      Catch::AssertionHandler::handleExpr<bool>(&local_90,(ExprLhs<bool> *)&local_a0);
      Catch::AssertionHandler::complete(&local_90);
      if (local_90.m_completed == false) {
        (*(local_90.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}